

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

void __thiscall xe::TcpIpRecvThread::stop(TcpIpRecvThread *this)

{
  bool bVar1;
  deBool dVar2;
  Error *this_00;
  byte local_29;
  TcpIpRecvThread *this_local;
  
  if ((this->m_isRunning & 1U) != 0) {
    do {
      dVar2 = deGetFalse();
      local_29 = 0;
      if (dVar2 == 0) {
        bVar1 = de::Socket::isReceiveOpen(this->m_socket);
        local_29 = bVar1 ^ 0xff;
      }
      if ((local_29 & 1) == 0) {
        this_00 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(this_00,(char *)0x0,"!m_socket.isReceiveOpen()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                     ,0x163);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    de::Thread::join(&this->super_Thread);
    this->m_isRunning = false;
  }
  return;
}

Assistant:

void TcpIpRecvThread::stop (void)
{
	if (m_isRunning)
	{
		// \note Socket must be closed before terminating receive thread.
		XE_CHECK(!m_socket.isReceiveOpen());

		join();
		m_isRunning = false;
	}
}